

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O2

_Bool get_section(char *line,char *name,char **value,char *full_line)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char buf [1024];
  
  _Var1 = prefix_i(line,name);
  if (_Var1) {
    _Var1 = *value == (char *)0x0;
    if (_Var1) {
      pcVar3 = strchr(line,0x3a);
      if (pcVar3 == (char *)0x0) {
        sVar4 = strlen(line);
        iVar2 = (int)sVar4;
      }
      else {
        iVar2 = (int)pcVar3 - (int)line;
      }
      sVar4 = (size_t)(int)(iVar2 - (uint)(line[iVar2 + -1] == ';'));
      strncpy(buf,line,sVar4);
      buf[sVar4] = '\0';
      pcVar3 = string_make(buf);
      *value = pcVar3;
    }
    else {
      borg_formula_error(line,full_line,"value","** section repeated");
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool get_section(
    char *line, const char *name, char **value, const char *full_line)
{
    char *start = line;
    if (prefix_i(line, name)) {
        char buf[1024];

        /* this value already exists */
        if (*value) {
            borg_formula_error(
                start, full_line, "value", "** section repeated");
            return false;
        }

        int   len;
        char *pos = line;
        line      = strchr(line, ':');
        if (line)
            len = line - pos;
        else
            len = strlen(pos);
        if (pos[len - 1] == ';')
            len--;
        strncpy(buf, pos, len);
        buf[len] = 0;
        *value   = string_make(buf);
        return true;
    }

    return false;
}